

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O0

bool Js::JavascriptNativeOperators::CheckIfPolyTypeIsEquivalent
               (Type *type,JitPolyEquivalentTypeGuard *guard,uint8 index)

{
  bool bVar1;
  ScriptContext *this;
  ThreadContext *threadContext;
  intptr_t guardValue;
  undefined1 local_40 [7];
  bool result;
  JsReentLock reentrancylock;
  uint8 index_local;
  JitPolyEquivalentTypeGuard *guard_local;
  Type *type_local;
  
  reentrancylock._31_1_ = index;
  this = Js::Type::GetScriptContext(type);
  threadContext = ScriptContext::GetThreadContext(this);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  guardValue = JitPolyEquivalentTypeGuard::GetPolyValue(guard,reentrancylock._31_1_);
  bVar1 = EquivalenceCheckHelper(type,&guard->super_JitEquivalentTypeGuard,guardValue);
  if (bVar1) {
    JitPolyEquivalentTypeGuard::SetPolyValue(guard,(intptr_t)type,reentrancylock._31_1_);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return bVar1;
}

Assistant:

bool JavascriptNativeOperators::CheckIfPolyTypeIsEquivalent(Type* type, JitPolyEquivalentTypeGuard* guard, uint8 index)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(CheckIfPolyTypeIsEquivalent, reentrancylock, type->GetScriptContext()->GetThreadContext());
        bool result = EquivalenceCheckHelper(type, guard, guard->GetPolyValue(index));
        if (result)
        {
            guard->SetPolyValue((intptr_t)type, index);
        }
        return result;
        JIT_HELPER_END(CheckIfPolyTypeIsEquivalent);
    }